

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall
binlog::PrettyPrinter::printEventMessage(PrettyPrinter *this,OstreamBuffer *out,Event *event)

{
  char c;
  EventSource *pEVar1;
  pointer pcVar2;
  ulong uVar3;
  Range *in_R8;
  string_view sVar4;
  string_view tag;
  Range args;
  string_view tags;
  ToStringVisitor visitor;
  char *local_78;
  char *pcStack_70;
  string_view local_60;
  ToStringVisitor local_50;
  
  local_60._ptr = (event->source->argumentTags)._M_dataplus._M_p;
  local_60._len = (event->source->argumentTags)._M_string_length;
  local_78 = (event->arguments)._begin;
  pcStack_70 = (event->arguments)._end;
  ToStringVisitor::ToStringVisitor(&local_50,out,this);
  pEVar1 = event->source;
  for (uVar3 = 0; uVar3 < (pEVar1->formatString)._M_string_length; uVar3 = uVar3 + 1) {
    pcVar2 = (pEVar1->formatString)._M_dataplus._M_p;
    c = pcVar2[uVar3];
    if ((c == '{') && (pcVar2[uVar3 + 1] == '}')) {
      uVar3 = uVar3 + 1;
      sVar4 = mserialize::detail::tag_pop(&local_60);
      tag._len = (size_t)&local_50;
      tag._ptr = (char *)sVar4._len;
      mserialize::visit<binlog::ToStringVisitor,binlog::Range>
                ((mserialize *)sVar4._ptr,tag,(ToStringVisitor *)&local_78,in_R8);
    }
    else {
      detail::OstreamBuffer::put(out,c);
    }
  }
  return;
}

Assistant:

void PrettyPrinter::printEventMessage(detail::OstreamBuffer& out, const Event& event) const
{
  mserialize::string_view tags = event.source->argumentTags;
  Range args = event.arguments;
  ToStringVisitor visitor(out, this);

  const std::string& fmt = event.source->formatString;
  for (std::size_t i = 0; i < fmt.size(); ++i)
  {
    const char c = fmt[i];
    if (c == '{' && fmt[i+1] == '}')
    {
      const mserialize::string_view tag = mserialize::detail::tag_pop(tags);
      mserialize::visit(tag, visitor, args);
      ++i; // skip }
    }
    else
    {
      out.put(c);
    }
  }
}